

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O3

bool ASDCP::ATMOS::IsDolbyAtmos(string *filename)

{
  int iVar1;
  ulong __n;
  bool bVar2;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"atmos","");
  Kumu::PathGetExtension((string *)&local_48);
  __n = local_60;
  if (local_40 < local_60) {
    __n = local_40;
  }
  if (__n != 0) {
    iVar1 = bcmp(local_68,local_48,__n);
    if (iVar1 != 0) {
      bVar2 = false;
      goto LAB_001e0671;
    }
  }
  bVar2 = local_60 == local_40;
LAB_001e0671:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return bVar2;
}

Assistant:

bool
ASDCP::ATMOS::IsDolbyAtmos(const std::string& filename)
{
    // TODO
    // For now use an atmos extension
    bool result = ( 0 == (std::string("atmos").compare(Kumu::PathGetExtension(filename))) );
    return result;
}